

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes ReadNumber(CSzData *sd,UInt64 *value)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  Byte *pBVar4;
  UInt64 highPart;
  Byte b;
  UInt32 v;
  uint i;
  Byte mask;
  Byte firstByte;
  UInt64 *value_local;
  CSzData *sd_local;
  SRes local_4;
  
  if (sd->Size == 0) {
    local_4 = 0x10;
  }
  else {
    sd->Size = sd->Size - 1;
    pbVar3 = sd->Data;
    sd->Data = pbVar3 + 1;
    bVar1 = *pbVar3;
    if ((bVar1 & 0x80) == 0) {
      *value = (ulong)bVar1;
      local_4 = 0;
    }
    else if (sd->Size == 0) {
      local_4 = 0x10;
    }
    else {
      sd->Size = sd->Size - 1;
      pbVar3 = sd->Data;
      sd->Data = pbVar3 + 1;
      bVar2 = *pbVar3;
      if ((bVar1 & 0x40) == 0) {
        *value = (ulong)((bVar1 & 0x3f) << 8 | (uint)bVar2);
        local_4 = 0;
      }
      else if (sd->Size == 0) {
        local_4 = 0x10;
      }
      else {
        sd->Size = sd->Size - 1;
        pBVar4 = sd->Data;
        sd->Data = pBVar4 + 1;
        *value = (ulong)CONCAT11(*pBVar4,bVar2);
        mask = ' ';
        for (i = 2; i < 8; i = i + 1) {
          if ((bVar1 & mask) == 0) {
            *value = (ulong)((uint)bVar1 & mask - 1) << ((byte)(i << 3) & 0x3f) | *value;
            return 0;
          }
          if (sd->Size == 0) {
            return 0x10;
          }
          sd->Size = sd->Size - 1;
          pbVar3 = sd->Data;
          sd->Data = pbVar3 + 1;
          *value = (ulong)*pbVar3 << ((byte)(i << 3) & 0x3f) | *value;
          mask = (Byte)((int)(uint)mask >> 1);
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static MY_NO_INLINE SRes ReadNumber(CSzData *sd, UInt64 *value)
{
  Byte firstByte, mask;
  unsigned i;
  UInt32 v;

  SZ_READ_BYTE(firstByte);
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    return SZ_OK;
  }
  SZ_READ_BYTE(v);
  if ((firstByte & 0x40) == 0)
  {
    *value = (((UInt32)firstByte & 0x3F) << 8) | v;
    return SZ_OK;
  }
  SZ_READ_BYTE(mask);
  *value = v | ((UInt32)mask << 8);
  mask = 0x20;
  for (i = 2; i < 8; i++)
  {
    Byte b;
    if ((firstByte & mask) == 0)
    {
      UInt64 highPart = (unsigned)firstByte & (unsigned)(mask - 1);
      *value |= (highPart << (8 * i));
      return SZ_OK;
    }
    SZ_READ_BYTE(b);
    *value |= ((UInt64)b << (8 * i));
    mask >>= 1;
  }
  return SZ_OK;
}